

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

bool __thiscall
capnp::compiler::NodeTranslator::compileType
          (NodeTranslator *this,Reader source,Builder target,ImplicitParams implicitMethodParams)

{
  BrandScope *pBVar1;
  bool bVar2;
  BrandedDecl local_168;
  Maybe<capnp::compiler::BrandedDecl> local_c0;
  
  BrandScope::compileDeclExpression
            (&local_c0,(this->localBrand).ptr,source,this->resolver,implicitMethodParams);
  if (local_c0.ptr.isSet == true) {
    local_168.body.tag = local_c0.ptr.field_1.value.body.tag;
    if (local_c0.ptr.field_1.value.body.tag == 2) {
      local_168.body.field_1._0_8_ = local_c0.ptr.field_1._8_8_;
      local_168.body.field_1._8_8_ = local_c0.ptr.field_1._16_8_;
    }
    else if (local_c0.ptr.field_1.value.body.tag == 1) {
      local_168.body.field_1._32_8_ = local_c0.ptr.field_1._40_8_;
      local_168.body.field_1._16_8_ = local_c0.ptr.field_1._24_8_;
      local_168.body.field_1._24_8_ = local_c0.ptr.field_1._32_8_;
      local_168.body.field_1._0_8_ = local_c0.ptr.field_1._8_8_;
      local_168.body.field_1._8_8_ = local_c0.ptr.field_1._16_8_;
      local_168.body.field_1.space[0x28] = local_c0.ptr.field_1._48_1_;
      if (local_c0.ptr.field_1._48_1_ == '\x01') {
        local_168.body.field_1._80_8_ = local_c0.ptr.field_1._88_8_;
        local_168.body.field_1._88_8_ = local_c0.ptr.field_1._96_8_;
        local_168.body.field_1._64_8_ = local_c0.ptr.field_1._72_8_;
        local_168.body.field_1._72_8_ = local_c0.ptr.field_1._80_8_;
        local_168.body.field_1._48_8_ = local_c0.ptr.field_1._56_8_;
        local_168.body.field_1._56_8_ = local_c0.ptr.field_1._64_8_;
        local_c0.ptr.field_1._48_1_ = '\0';
      }
    }
    local_168.brand.disposer = local_c0.ptr.field_1.value.brand.disposer;
    local_168.brand.ptr = local_c0.ptr.field_1.value.brand.ptr;
    local_168.source._reader.segment = local_c0.ptr.field_1.value.source._reader.segment;
    local_168.source._reader.capTable = local_c0.ptr.field_1.value.source._reader.capTable;
    local_168.source._reader.data = local_c0.ptr.field_1.value.source._reader.data;
    local_168.source._reader.pointers = local_c0.ptr.field_1.value.source._reader.pointers;
    local_168.source._reader.dataSize = local_c0.ptr.field_1.value.source._reader.dataSize;
    local_168.source._reader.pointerCount = local_c0.ptr.field_1.value.source._reader.pointerCount;
    local_168.source._reader._38_2_ = local_c0.ptr.field_1._158_2_;
    local_168.source._reader._40_8_ = local_c0.ptr.field_1._160_8_;
    bVar2 = BrandedDecl::compileAsType(&local_168,this->errorReporter,target);
  }
  else {
    bVar2 = false;
  }
  pBVar1 = local_168.brand.ptr;
  if (((local_c0.ptr.isSet & 1U) != 0) && (local_168.brand.ptr != (BrandScope *)0x0)) {
    local_168.brand.ptr = (BrandScope *)0x0;
    (**(local_168.brand.disposer)->_vptr_Disposer)
              (local_168.brand.disposer,
               (pBVar1->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
               (long)&(pBVar1->super_Refcounted).super_Disposer._vptr_Disposer);
  }
  return bVar2;
}

Assistant:

bool NodeTranslator::compileType(Expression::Reader source, schema::Type::Builder target,
                                 ImplicitParams implicitMethodParams) {
  KJ_IF_SOME(decl, compileDeclExpression(source, implicitMethodParams)) {
    return decl.compileAsType(errorReporter, target);
  } else {
    return false;
  }
}